

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O2

_Bool IoTHubMessage_IsSecurityMessage(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle)

{
  LOGGER_LOG p_Var1;
  undefined1 uVar2;
  
  if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_IsSecurityMessage",0x474,1,
                "Invalid argument (iotHubMessageHandle is NULL)");
    }
  }
  else {
    uVar2 = iotHubMessageHandle->is_security_message;
  }
  return (_Bool)uVar2;
}

Assistant:

bool IoTHubMessage_IsSecurityMessage(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle)
{
    bool result;
    if (iotHubMessageHandle == NULL)
    {
        LogError("Invalid argument (iotHubMessageHandle is NULL)");
        result = false;
    }
    else
    {
        result = iotHubMessageHandle->is_security_message;
    }
    return result;
}